

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O3

void __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::invalid_expression
          (rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_expression_t *expr,string *expected)

{
  invalid_argument *this_00;
  long *plVar1;
  long *plVar2;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  expression_t::to_string_abi_cxx11_
            (&local_b0,(expression_t *)(&expr->field_0x0 + *(long *)(*(long *)expr + -0x38)));
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x1e02dc);
  local_90 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_90 == plVar2) {
    local_80 = *plVar2;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar2;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_70 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_70 == plVar2) {
    local_60 = *plVar2;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar2;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)(expected->_M_dataplus)._M_p);
  local_50 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_50 == plVar2) {
    local_40 = *plVar2;
    lStack_38 = plVar1[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar2;
  }
  local_48 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_d0 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_d0 == plVar2) {
    local_c0 = *plVar2;
    lStack_b8 = plVar1[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar2;
  }
  local_c8 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::invalid_argument::invalid_argument(this_00,(string *)&local_d0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void invalid_expression(tchecker::typed_expression_t const & expr, std::string expected)
  {
    throw std::invalid_argument("invalid expression '" + expr.to_string() + "' where " + expected + " is expected.");
  }